

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

void __thiscall
rapidjson::internal::
SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::~SchemaValidationContext
          (SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
           *this)

{
  ulong uVar1;
  
  if (this->hasher != (void *)0x0) {
    (*this->factory->_vptr_ISchemaStateFactory[6])();
  }
  if (this->validators != (ISchemaValidator **)0x0) {
    if (this->validatorCount != 0) {
      uVar1 = 0;
      do {
        if (this->validators[uVar1] != (ISchemaValidator *)0x0) {
          (*this->factory->_vptr_ISchemaStateFactory[3])();
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 < this->validatorCount);
    }
    (*this->factory->_vptr_ISchemaStateFactory[8])(this->factory,this->validators);
  }
  if (this->patternPropertiesValidators != (ISchemaValidator **)0x0) {
    if (this->patternPropertiesValidatorCount != 0) {
      uVar1 = 0;
      do {
        if (this->patternPropertiesValidators[uVar1] != (ISchemaValidator *)0x0) {
          (*this->factory->_vptr_ISchemaStateFactory[3])();
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 < this->patternPropertiesValidatorCount);
    }
    (*this->factory->_vptr_ISchemaStateFactory[8])(this->factory,this->patternPropertiesValidators);
  }
  if (this->patternPropertiesSchemas != (SchemaType **)0x0) {
    (*this->factory->_vptr_ISchemaStateFactory[8])();
  }
  if (this->propertyExist != (bool *)0x0) {
    (*this->factory->_vptr_ISchemaStateFactory[8])();
  }
  return;
}

Assistant:

~SchemaValidationContext() {
        if (hasher)
            factory.DestroryHasher(hasher);
        if (validators) {
            for (SizeType i = 0; i < validatorCount; i++) {
                if (validators[i]) {
                    factory.DestroySchemaValidator(validators[i]);
                }
            }
            factory.FreeState(validators);
        }
        if (patternPropertiesValidators) {
            for (SizeType i = 0; i < patternPropertiesValidatorCount; i++) {
                if (patternPropertiesValidators[i]) {
                    factory.DestroySchemaValidator(patternPropertiesValidators[i]);
                }
            }
            factory.FreeState(patternPropertiesValidators);
        }
        if (patternPropertiesSchemas)
            factory.FreeState(patternPropertiesSchemas);
        if (propertyExist)
            factory.FreeState(propertyExist);
    }